

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  pointer pcVar1;
  size_type sVar2;
  string *psVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  size_type local_30;
  pointer local_28;
  
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  sVar2 = psVar3->_M_string_length;
  psVar3 = cmTarget::GetName_abi_cxx11_(this->Target);
  local_40 = 0xc;
  local_38 = "/CMakeFiles/";
  local_28 = (psVar3->_M_dataplus)._M_p;
  local_30 = psVar3->_M_string_length;
  views._M_len = 3;
  views._M_array = &local_50;
  local_50._M_len = sVar2;
  local_50._M_str = pcVar1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSupportDirectory() const
{
  std::string dir = cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(),
                             "/CMakeFiles/", this->GetName());
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}